

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processor.hpp
# Opt level: O2

void __thiscall Processor::Processor(Processor *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  mapped_type *pmVar3;
  int i;
  ulong uVar4;
  key_type pRVar5;
  key_type pRVar6;
  key_type pRVar7;
  char buffer [256];
  allocator<char> local_171;
  vector<ToWriteBack,_std::allocator<ToWriteBack>_> *local_170;
  key_type local_168;
  map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_160;
  key_type local_158 [4];
  char local_138 [264];
  
  this->cycle = 0;
  this->jumping = false;
  local_170 = &this->to_write_back;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&this->registers[0].value + lVar2) = 0;
    *(undefined8 *)((long)&this->registers[0].rs + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x200);
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->rs_names)._M_t._M_impl.super__Rb_tree_header;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x29c);
  local_158[0] = (key_type)0x0;
  local_160 = &this->rs_names;
  pmVar3 = std::
           map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->rs_names,local_158);
  std::__cxx11::string::assign((char *)pmVar3);
  pRVar6 = this->add_sub_rs;
  pRVar5 = this->mul_div_rs;
  pRVar7 = this->load_rs;
  for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
    sprintf(local_138,"ADD_SUB_RS[%d]",uVar4 & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_158,local_138,&local_171);
    local_168 = pRVar6;
    pmVar3 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_160,&local_168);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    pRVar6 = pRVar6 + 1;
  }
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    sprintf(local_138,"MUL_DIV_RS[%d]",uVar4 & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_158,local_138,&local_171);
    local_168 = pRVar5;
    pmVar3 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_160,&local_168);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    pRVar5 = pRVar5 + 1;
  }
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    sprintf(local_138,"LOAD_RS[%d]",uVar4 & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_158,local_138,&local_171);
    local_168 = pRVar7;
    pmVar3 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_160,&local_168);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    pRVar7 = pRVar7 + 1;
  }
  return;
}

Assistant:

Processor() {
        char buffer[256];
        rs_names[nullptr] = "null";
        for (int i = 0; i < NUM_ADD_SUB_RS; ++ i)
            sprintf(buffer, "ADD_SUB_RS[%d]", i), rs_names[&add_sub_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_MUL_DIV_RS; ++ i)
            sprintf(buffer, "MUL_DIV_RS[%d]", i), rs_names[&mul_div_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_LOAD_RS; ++ i)
            sprintf(buffer, "LOAD_RS[%d]", i), rs_names[&load_rs[i]] = std::string(buffer);
    }